

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_mkdir(char *_dname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  _func_int_void_ptr_char_ptr *p_Var3;
  bool bVar4;
  DirHandle *pDVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  long *plVar9;
  long lVar10;
  char *pcVar11;
  ErrState *pEVar12;
  void **retval;
  PHYSFS_Stat *pPVar13;
  PHYSFS_ErrorCode errcode;
  long *__s;
  PHYSFS_Stat local_68;
  long *local_40;
  long *local_38;
  
  pPVar13 = &local_68;
  if (_dname == (char *)0x0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_001085e6:
    PHYSFS_setErrorCode(errcode);
    uVar7 = 0;
  }
  else {
    sVar8 = strlen(_dname);
    if (sVar8 + 1 < 0x100) {
      plVar9 = (long *)((long)&local_68 - (sVar8 + 0x18 & 0xfffffffffffffff0));
      lVar10 = 0;
      pPVar13 = (PHYSFS_Stat *)plVar9;
    }
    else {
      plVar9 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar8 + 9);
      if (plVar9 == (long *)0x0) {
        errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_001085e6;
      }
      lVar10 = 1;
    }
    *plVar9 = lVar10;
    local_38 = plVar9 + 1;
    *(undefined8 *)((long)pPVar13 + -8) = 0x1084dd;
    iVar6 = sanitizePlatformIndependentPath(_dname,(char *)(plVar9 + 1));
    if (iVar6 == 0) {
      uVar7 = 0;
    }
    else {
      *(undefined8 *)((long)pPVar13 + -8) = 0x1084f1;
      __PHYSFS_platformGrabMutex(stateLock);
      pDVar5 = writeDir;
      local_40 = plVar9;
      if (writeDir == (DirHandle *)0x0) {
        *(undefined8 *)((long)pPVar13 + -8) = 0x1085bd;
        PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
      }
      else {
        bVar4 = true;
        *(undefined8 *)((long)pPVar13 + -8) = 0x10851b;
        iVar6 = verifyPath(writeDir,(char **)&local_38,1);
        plVar9 = local_38;
        __s = local_38;
        if (iVar6 != 0) {
          do {
            *(undefined8 *)((long)pPVar13 + -8) = 0x108537;
            pcVar11 = strchr((char *)__s,0x2f);
            if (pcVar11 != (char *)0x0) {
              *pcVar11 = '\0';
            }
            if (bVar4) {
              pvVar1 = pDVar5->opaque;
              p_Var2 = pDVar5->funcs->stat;
              *(undefined8 *)((long)pPVar13 + -8) = 0x108559;
              iVar6 = (*p_Var2)(pvVar1,(char *)plVar9,&local_68);
              if (iVar6 == 0) {
                *(undefined8 *)((long)pPVar13 + -8) = 0x10857a;
                pEVar12 = findErrorForCurrentThread();
                if ((pEVar12 != (ErrState *)0x0) && (pEVar12->code == PHYSFS_ERR_NOT_FOUND))
                goto LAB_00108585;
              }
              uVar7 = (uint)(local_68.filetype == PHYSFS_FILETYPE_DIRECTORY && iVar6 != 0);
            }
            else {
LAB_00108585:
              pvVar1 = pDVar5->opaque;
              p_Var3 = pDVar5->funcs->mkdir;
              *(undefined8 *)((long)pPVar13 + -8) = 0x108592;
              uVar7 = (*p_Var3)(pvVar1,(char *)plVar9);
              bVar4 = false;
            }
            if ((pcVar11 == (char *)0x0) || (uVar7 == 0)) goto LAB_001085c0;
            *pcVar11 = '/';
            __s = (long *)(pcVar11 + 1);
          } while( true );
        }
      }
      uVar7 = 0;
LAB_001085c0:
      *(undefined8 *)((long)pPVar13 + -8) = 0x1085cc;
      __PHYSFS_platformReleaseMutex(stateLock);
      plVar9 = local_40;
    }
    if (*plVar9 != 0) {
      *(undefined8 *)((long)pPVar13 + -8) = 0x1085df;
      (*__PHYSFS_AllocatorHooks.Free)(plVar9);
    }
  }
  return uVar7;
}

Assistant:

int PHYSFS_mkdir(const char *_dname)
{
    int retval = 0;
    char *dname;
    size_t len;

    BAIL_IF(!_dname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_dname) + 1;
    dname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!dname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doMkdir(_dname, dname);
    __PHYSFS_smallFree(dname);
    return retval;
}